

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void dropCell(MemPage *pPage,int idx,int sz,int *pRC)

{
  ushort uVar1;
  u8 *puVar2;
  u8 *puVar3;
  uint start;
  uint uVar4;
  int iVar5;
  int hdr;
  int rc;
  u8 *endPtr;
  u8 *ptr;
  u8 *data;
  u32 pc;
  int *pRC_local;
  int sz_local;
  int idx_local;
  MemPage *pPage_local;
  
  if (*pRC == 0) {
    puVar2 = pPage->aData;
    endPtr = pPage->aCellIdx + (idx << 1);
    start = (uint)CONCAT11(*endPtr,endPtr[1]);
    uVar4 = (uint)pPage->hdrOffset;
    if ((start < CONCAT11(puVar2[(int)(uVar4 + 5)],puVar2[(long)(int)(uVar4 + 5) + 1])) ||
       (pPage->pBt->usableSize < start + sz)) {
      iVar5 = sqlite3CorruptError(0xd79b);
      *pRC = iVar5;
    }
    else {
      iVar5 = freeSpace(pPage,start,sz);
      if (iVar5 == 0) {
        puVar3 = pPage->aCellIdx;
        uVar1 = pPage->nCell;
        for (; endPtr < puVar3 + (int)((uint)uVar1 * 2 + -2); endPtr = endPtr + 2) {
          *(undefined2 *)endPtr = *(undefined2 *)(endPtr + 2);
        }
        pPage->nCell = pPage->nCell - 1;
        puVar2[(int)(uVar4 + 3)] = (u8)(pPage->nCell >> 8);
        puVar2[(long)(int)(uVar4 + 3) + 1] = (u8)pPage->nCell;
        pPage->nFree = pPage->nFree + 2;
      }
      else {
        *pRC = iVar5;
      }
    }
  }
  return;
}

Assistant:

static void dropCell(MemPage *pPage, int idx, int sz, int *pRC){
  u32 pc;         /* Offset to cell content of cell being deleted */
  u8 *data;       /* pPage->aData */
  u8 *ptr;        /* Used to move bytes around within data[] */
  u8 *endPtr;     /* End of loop */
  int rc;         /* The return code */
  int hdr;        /* Beginning of the header.  0 most pages.  100 page 1 */

  if( *pRC ) return;

  assert( idx>=0 && idx<pPage->nCell );
  assert( sz==cellSize(pPage, idx) );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  data = pPage->aData;
  ptr = &pPage->aCellIdx[2*idx];
  pc = get2byte(ptr);
  hdr = pPage->hdrOffset;
  testcase( pc==get2byte(&data[hdr+5]) );
  testcase( pc+sz==pPage->pBt->usableSize );
  if( pc < (u32)get2byte(&data[hdr+5]) || pc+sz > pPage->pBt->usableSize ){
    *pRC = SQLITE_CORRUPT_BKPT;
    return;
  }
  rc = freeSpace(pPage, pc, sz);
  if( rc ){
    *pRC = rc;
    return;
  }
  endPtr = &pPage->aCellIdx[2*pPage->nCell - 2];
  assert( (SQLITE_PTR_TO_INT(ptr)&1)==0 );  /* ptr is always 2-byte aligned */
  while( ptr<endPtr ){
    *(u16*)ptr = *(u16*)&ptr[2];
    ptr += 2;
  }
  pPage->nCell--;
  put2byte(&data[hdr+3], pPage->nCell);
  pPage->nFree += 2;
}